

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void print_footer(OSQPInfo *info,c_int polish)

{
  char *__s;
  
  putchar(10);
  printf("status:               %s\n",info->status);
  if ((polish != 0) && (info->status_val == 1)) {
    if (info->status_polish == 1) {
      __s = "solution polish:      successful";
    }
    else {
      if (-1 < info->status_polish) goto LAB_0010991e;
      __s = "solution polish:      unsuccessful";
    }
    puts(__s);
  }
LAB_0010991e:
  printf("number of iterations: %i\n",(ulong)(uint)info->iter);
  if (info->status_val - 1U < 2) {
    printf("optimal objective:    %.4f\n",info->obj_val);
  }
  printf("run time:             %.2es\n",info->run_time);
  printf("optimal rho estimate: %.2e\n",info->rho_estimate);
  putchar(10);
  return;
}

Assistant:

void print_footer(OSQPInfo *info, c_int polish) {
  c_print("\n"); // Add space after iterations

  c_print("status:               %s\n", info->status);

  if (polish && (info->status_val == OSQP_SOLVED)) {
    if (info->status_polish == 1) {
      c_print("solution polish:      successful\n");
    } else if (info->status_polish < 0) {
      c_print("solution polish:      unsuccessful\n");
    }
  }

  c_print("number of iterations: %i\n", (int)info->iter);

  if ((info->status_val == OSQP_SOLVED) ||
      (info->status_val == OSQP_SOLVED_INACCURATE)) {
    c_print("optimal objective:    %.4f\n", info->obj_val);
  }

# ifdef PROFILING
  c_print("run time:             %.2es\n", info->run_time);
# endif /* ifdef PROFILING */

# if EMBEDDED != 1
  c_print("optimal rho estimate: %.2e\n", info->rho_estimate);
# endif /* if EMBEDDED != 1 */
  c_print("\n");
}